

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void qt_rectfill_quint64(QRasterBuffer *rasterBuffer,int x,int y,int width,int height,QRgba64 *color
                        )

{
  ulong uVar1;
  quint64 qVar2;
  int iVar3;
  quint64 *pqVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  quint64 c64;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  c64 = (quint64)&DAT_aaaaaaaaaaaaaaaa;
  (*qStoreFromRGBA64PM[rasterBuffer->format])
            ((uchar *)&c64,color,0,1,(QList<unsigned_int> *)0x0,(QDitherInfo *)0x0);
  qVar2 = c64;
  uVar1 = rasterBuffer->bytes_per_line;
  pqVar4 = (quint64 *)(rasterBuffer->m_buffer + (long)y * uVar1 + (long)x * 8);
  lVar5 = (long)width;
  if ((uVar1 & 0xffffffff) == lVar5 * 8) {
    (*qt_memfill64)(pqVar4,c64,height * lVar5);
  }
  else {
    iVar3 = 0;
    if (0 < height) {
      iVar3 = height;
    }
    while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
      (*qt_memfill64)(pqVar4,qVar2,lVar5);
      pqVar4 = (quint64 *)((long)pqVar4 + uVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_rectfill_quint64(QRasterBuffer *rasterBuffer,
                                int x, int y, int width, int height,
                                const QRgba64 &color)
{
    const auto store = qStoreFromRGBA64PM[rasterBuffer->format];
    quint64 c64;
    store(reinterpret_cast<uchar *>(&c64), &color, 0, 1, nullptr, nullptr);
    qt_rectfill<quint64>(reinterpret_cast<quint64 *>(rasterBuffer->buffer()),
                         c64, x, y, width, height, rasterBuffer->bytesPerLine());
}